

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O2

char base64char(uchar val)

{
  if (val < 0x1a) {
    return val + 'A';
  }
  if (val < 0x34) {
    return val + 'G';
  }
  if (val < 0x3e) {
    return val + 0xfc;
  }
  return (val != '>') << 2 | 0x2b;
}

Assistant:

static char base64char(unsigned char val)
{
    char result;

    if (val < 26)
    {
        result = 'A' + (char)val;
    }
    else if (val < 52)
    {
        result = 'a' + ((char)val - 26);
    }
    else if (val < 62)
    {
        result = '0' + ((char)val - 52);
    }
    else if (val == 62)
    {
        result = '+';
    }
    else
    {
        result = '/';
    }

    return result;
}